

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderRendering.cpp
# Opt level: O1

void __thiscall
glcts::GeometryShaderRenderingCase::executeTest
          (GeometryShaderRenderingCase *this,_draw_call_type type)

{
  undefined4 uVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  undefined4 uVar7;
  deUint32 dVar8;
  undefined4 extraout_var;
  long lVar10;
  void *pvVar11;
  TestError *this_00;
  long lVar12;
  GLuint GVar13;
  uint uVar14;
  uint rt_width;
  uint rt_height;
  uint single_rt_width;
  uint single_rt_height;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  long lVar9;
  
  uVar2 = (ulong)type;
  iVar3 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar3);
  local_44 = (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[0x12])(this);
  iVar3 = (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[0x13])(this);
  iVar4 = (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[0x14])(this);
  iVar5 = (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[8])(this);
  local_48 = (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[6])(this);
  uVar6 = (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[5])(this);
  local_40 = (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[7])(this);
  uVar7 = (**(code **)(lVar9 + 0x780))(this->m_po_id,"position");
  local_4c = 0;
  local_50 = 0;
  local_38 = 0;
  local_3c = 0;
  if ((type < (DRAW_CALL_TYPE_GL_DRAW_RANGE_ELEMENTS|DRAW_CALL_TYPE_GL_DRAW_ARRAYS_INSTANCED)) &&
     ((0x15U >> (type & 0x1f) & 1) != 0)) {
    uVar6 = 1;
    lVar10 = 0x2f0;
    lVar12 = 0x2ec;
  }
  else {
    lVar10 = 0x2fc;
    lVar12 = 0x2f8;
  }
  local_34 = *(undefined4 *)
              ((long)&(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode +
              lVar12);
  uVar1 = *(undefined4 *)
           ((long)&(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode + lVar10)
  ;
  (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[0xd])
            (this,(ulong)uVar6,&local_50,&local_4c);
  (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[0xd])
            (this,1,&local_3c,&local_38);
  switch(uVar2) {
  case 0:
    GVar13 = this->m_noninstanced_raw_arrays_bo_id;
    break;
  case 1:
    GVar13 = this->m_instanced_raw_arrays_bo_id;
    break;
  case 2:
  case 4:
    GVar13 = this->m_noninstanced_unordered_arrays_bo_id;
    break;
  case 3:
    GVar13 = this->m_instanced_unordered_arrays_bo_id;
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized draw call mode",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
               ,0x2d8);
    goto LAB_00d1f2d0;
  }
  (**(code **)(lVar9 + 0x40))(0x8892,GVar13);
  (**(code **)(lVar9 + 0x19f0))(uVar7,4,0x1406,0,0,0);
  (**(code **)(lVar9 + 0x610))(uVar7);
  switch(uVar2) {
  case 0:
  case 1:
    GVar13 = 0;
    break;
  case 2:
  case 4:
    GVar13 = this->m_noninstanced_unordered_elements_bo_id;
    break;
  case 3:
    GVar13 = this->m_instanced_unordered_elements_bo_id;
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized draw call mode",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
               ,0x2fc);
    goto LAB_00d1f2d0;
  }
  (**(code **)(lVar9 + 0x40))(0x8893,GVar13);
  (**(code **)(lVar9 + 0x78))(0x8ca9,local_34);
  (**(code **)(lVar9 + 0x1a00))(0,0,local_50,local_4c);
  (**(code **)(lVar9 + 0x1c0))(0,0,0,0);
  (**(code **)(lVar9 + 0x188))(0x4000);
  dVar8 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar8,"Test set-up failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                  ,0x308);
  (**(code **)(lVar9 + 0x1680))(this->m_po_id);
  (**(code **)(lVar9 + 0x1530))(this->m_renderingTargetSize_uniform_location,local_50,local_4c);
  (**(code **)(lVar9 + 0x1530))
            (this->m_singleRenderingTargetSize_uniform_location,local_3c,local_38);
  (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(this,uVar2);
  switch(uVar2) {
  case 0:
    (**(code **)(lVar9 + 0x538))(iVar5,0,local_40);
    break;
  case 1:
    (**(code **)(lVar9 + 0x548))(iVar5,0,local_40,uVar6);
    break;
  case 2:
    (**(code **)(lVar9 + 0x568))(iVar5,local_48,local_44,0);
    break;
  case 3:
    (**(code **)(lVar9 + 0x580))(iVar5,local_48,local_44,0,uVar6);
    break;
  case 4:
    (**(code **)(lVar9 + 0x5a0))(iVar5,(char)iVar4,(char)iVar3,local_48,local_44,0);
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized draw call mode",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
               ,0x339);
LAB_00d1f2d0:
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  dVar8 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar8,"Draw call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                  ,0x33d);
  pvVar11 = operator_new__((ulong)(uint)(local_4c * local_50 * 4));
  (**(code **)(lVar9 + 0x78))(0x8ca8,uVar1);
  uVar14 = 0;
  (**(code **)(lVar9 + 0x1220))(0,0,local_50,local_4c,0x1908,0x1401,pvVar11);
  dVar8 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar8,"glReadPixels() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                  ,0x345);
  if (uVar6 != 0) {
    do {
      (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[0x16])
                (this,uVar2,(ulong)uVar14,pvVar11);
      uVar14 = uVar14 + 1;
    } while (uVar6 != uVar14);
  }
  operator_delete__(pvVar11);
  return;
}

Assistant:

void GeometryShaderRenderingCase::executeTest(GeometryShaderRenderingCase::_draw_call_type type)
{
	glw::GLuint			  draw_fbo_id				  = 0;
	const glw::Functions& gl						  = m_context.getRenderContext().getFunctions();
	const glw::GLenum	 index_type				  = getUnorderedElementsDataType();
	const glw::GLubyte	max_elements_index		  = getUnorderedElementsMaxIndex();
	const glw::GLubyte	min_elements_index		  = getUnorderedElementsMinIndex();
	const glw::GLenum	 mode						  = getDrawCallMode();
	unsigned int		  n_elements				  = getAmountOfElementsPerInstance();
	unsigned int		  n_instance				  = 0;
	unsigned int		  n_instances				  = getAmountOfDrawInstances();
	const unsigned int	n_vertices				  = getAmountOfVerticesPerInstance();
	const glw::GLint	  position_attribute_location = gl.getAttribLocation(m_po_id, "position");
	glw::GLuint			  read_fbo_id				  = 0;
	unsigned int		  rt_height					  = 0;
	unsigned int		  rt_width					  = 0;
	unsigned int		  single_rt_height			  = 0;
	unsigned int		  single_rt_width			  = 0;

	/* Reduce n_instances to 1 for non-instanced draw call modes */
	if (type == DRAW_CALL_TYPE_GL_DRAW_ARRAYS || type == DRAW_CALL_TYPE_GL_DRAW_ELEMENTS ||
		type == DRAW_CALL_TYPE_GL_DRAW_RANGE_ELEMENTS)
	{
		draw_fbo_id = m_fbo_id;
		n_instances = 1;
		read_fbo_id = m_read_fbo_id;
	}
	else
	{
		draw_fbo_id = m_instanced_fbo_id;
		read_fbo_id = m_instanced_read_fbo_id;
	}

	/* Retrieve render-target size */
	getRenderTargetSize(n_instances, &rt_width, &rt_height);
	getRenderTargetSize(1, &single_rt_width, &single_rt_height);

	/* Configure GL_ARRAY_BUFFER binding */
	switch (type)
	{
	case DRAW_CALL_TYPE_GL_DRAW_ARRAYS:
	{
		gl.bindBuffer(GL_ARRAY_BUFFER, m_noninstanced_raw_arrays_bo_id);

		break;
	}

	case DRAW_CALL_TYPE_GL_DRAW_ARRAYS_INSTANCED:
	{
		gl.bindBuffer(GL_ARRAY_BUFFER, m_instanced_raw_arrays_bo_id);

		break;
	}

	case DRAW_CALL_TYPE_GL_DRAW_ELEMENTS_INSTANCED:
	{
		gl.bindBuffer(GL_ARRAY_BUFFER, m_instanced_unordered_arrays_bo_id);

		break;
	}

	case DRAW_CALL_TYPE_GL_DRAW_ELEMENTS:
	case DRAW_CALL_TYPE_GL_DRAW_RANGE_ELEMENTS:
	{
		gl.bindBuffer(GL_ARRAY_BUFFER, m_noninstanced_unordered_arrays_bo_id);

		break;
	}

	default:
	{
		/* Unrecognized draw call mode */
		TCU_FAIL("Unrecognized draw call mode");
	}
	} /* switch (type) */

	gl.vertexAttribPointer(position_attribute_location, 4, GL_FLOAT, GL_FALSE, 0 /* stride */, NULL);
	gl.enableVertexAttribArray(position_attribute_location);

	/* Configure GL_ELEMENT_ARRAY_BUFFER binding */
	switch (type)
	{
	case DRAW_CALL_TYPE_GL_DRAW_ARRAYS:
	case DRAW_CALL_TYPE_GL_DRAW_ARRAYS_INSTANCED:
	{
		gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0);

		break;
	}

	case DRAW_CALL_TYPE_GL_DRAW_ELEMENTS_INSTANCED:
	{
		gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_instanced_unordered_elements_bo_id);

		break;
	}

	case DRAW_CALL_TYPE_GL_DRAW_ELEMENTS:
	case DRAW_CALL_TYPE_GL_DRAW_RANGE_ELEMENTS:
	{
		gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_noninstanced_unordered_elements_bo_id);

		break;
	}

	default:
	{
		/* Unrecognized draw call mode */
		TCU_FAIL("Unrecognized draw call mode");
	}
	} /* switch (type) */

	/* Configure draw framebuffer */
	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, draw_fbo_id);
	gl.viewport(0 /* x */, 0 /* y */, rt_width, rt_height);

	/* Clear the color buffer. */
	gl.clearColor(0.0f /* red */, 0.0f /* green */, 0.0f /* blue */, 0.0f /* alpha */);
	gl.clear(GL_COLOR_BUFFER_BIT);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Test set-up failed.");

	/* Render the test geometry */
	gl.useProgram(m_po_id);
	gl.uniform2i(m_renderingTargetSize_uniform_location, rt_width, rt_height);
	gl.uniform2i(m_singleRenderingTargetSize_uniform_location, single_rt_width, single_rt_height);

	setUniformsBeforeDrawCall(type);

	switch (type)
	{
	case DRAW_CALL_TYPE_GL_DRAW_ARRAYS:
	{
		gl.drawArrays(mode, 0 /* first */, n_vertices);

		break;
	}

	case DRAW_CALL_TYPE_GL_DRAW_ARRAYS_INSTANCED:
	{
		gl.drawArraysInstanced(mode, 0 /* first */, n_vertices, n_instances);

		break;
	}

	case DRAW_CALL_TYPE_GL_DRAW_ELEMENTS:
	{
		gl.drawElements(mode, n_elements, index_type, NULL);

		break;
	}

	case DRAW_CALL_TYPE_GL_DRAW_ELEMENTS_INSTANCED:
	{
		gl.drawElementsInstanced(mode, n_elements, index_type, NULL, n_instances);

		break;
	}

	case DRAW_CALL_TYPE_GL_DRAW_RANGE_ELEMENTS:
	{
		gl.drawRangeElements(mode, min_elements_index, max_elements_index, n_elements, index_type, NULL);

		break;
	}

	default:
	{
		/* Unrecognized draw call mode */
		TCU_FAIL("Unrecognized draw call mode");
	}
	} /* switch (type) */

	GLU_EXPECT_NO_ERROR(gl.getError(), "Draw call failed.");

	/* Retrieve rendered data */
	unsigned char* rendered_data = new unsigned char[rt_height * rt_width * 4 /* components */];

	gl.bindFramebuffer(GL_READ_FRAMEBUFFER, read_fbo_id);
	gl.readPixels(0 /* x */, 0 /* y */, rt_width, rt_height, GL_RGBA, GL_UNSIGNED_BYTE, rendered_data);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels() call failed");

	/* Verify if the test succeeded */
	for (n_instance = 0; n_instance < n_instances; ++n_instance)
	{
		verify(type, n_instance, rendered_data);
	} /* for (all instances) */

	/* Release the data buffer */
	delete[] rendered_data;
}